

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

void huelang::InitializeCore(Environment *env)

{
  Definition *pDVar1;
  undefined8 *puVar2;
  Word WVar3;
  Word WVar4;
  Word word;
  Word word_00;
  Word word_01;
  Word word_02;
  Word word_03;
  Word word_04;
  Word word_05;
  Word word_06;
  allocator<char> local_16d;
  uint local_16c;
  uint local_168;
  uint local_164;
  unsigned_long local_160;
  unsigned_long local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"primary",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_50);
  WVar4.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_50);
  WVar4._4_4_ = 0;
  WVar4._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,WVar4,__primary);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"__intstate",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_70);
  word.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_70);
  word._4_4_ = 0;
  word._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,word,__instate_flag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"__wordcomprehension",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_90);
  word_00.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_90);
  word_00._4_4_ = 0;
  word_00._0_4_ = WVar3._0_4_;
  local_164 = WVar3._0_4_;
  local_158 = word_00.minor;
  Environment::AddPrimaryDefinition(env,word_00,__word_comprehension);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"__undefinedfinal",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_b0);
  word_01.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_b0);
  word_01._4_4_ = 0;
  word_01._0_4_ = WVar3._0_4_;
  local_168 = WVar3._0_4_;
  local_160 = word_01.minor;
  Environment::AddPrimaryDefinition(env,word_01,__undefined_final);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"composite",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_d0);
  word_02.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_d0);
  word_02._4_4_ = 0;
  word_02._0_4_ = WVar3._0_4_;
  local_16c = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,word_02,__composite);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"inaction",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_f0);
  word_03.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_f0);
  word_03._4_4_ = 0;
  word_03._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,word_03,__inaction);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"preeval",&local_16d);
  WVar4 = DefinitionTable::TokToWord(&env->definitionTable,&local_110);
  word_04.minor = WVar4.minor;
  std::__cxx11::string::~string((string *)&local_110);
  word_04._4_4_ = 0;
  word_04._0_4_ = WVar4._0_4_;
  pDVar1 = DefinitionTable::operator[](&env->definitionTable,word_04);
  (pDVar1->type).major = WVar3.major;
  (pDVar1->type).minor = word_03.minor;
  (pDVar1->value).pointer = (void *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"undefined",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_130);
  word_05.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_130);
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *(short *)puVar2 = (short)local_164;
  puVar2[1] = local_158;
  *(short *)(puVar2 + 2) = (short)local_168;
  puVar2[3] = local_160;
  word_05._4_4_ = 0;
  word_05._0_4_ = WVar3._0_4_;
  pDVar1 = DefinitionTable::operator[](&env->definitionTable,word_05);
  (pDVar1->type).major = (unsigned_short)local_16c;
  (pDVar1->type).minor = word_02.minor;
  (pDVar1->value).pointer = puVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"use",&local_16d);
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_150);
  word_06.minor = WVar3.minor;
  std::__cxx11::string::~string((string *)&local_150);
  word_06._4_4_ = 0;
  word_06._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,word_06,__use);
  return;
}

Assistant:

void InitializeCore(Environment& env) {
        //Word wordword = env.definitionTable.TokToWord(WORDWORD);

        Word primaryword = env.definitionTable.TokToWord(PRIMARYDEFINITIONWORD);
        env.AddPrimaryDefinition(primaryword, &__primary);

        Word intflagword = env.definitionTable.TokToWord(INTSTATEFLAG);
        env.AddPrimaryDefinition(intflagword, &__instate_flag);

        Word wordcompword 
            = env.definitionTable.TokToWord(WORDCOMPREHENSIONWORD);
        env.AddPrimaryDefinition(wordcompword, &__word_comprehension);

        Word undefinedfinalword
            = env.definitionTable.TokToWord(UNDEFINEDFINALWORD);
        env.AddPrimaryDefinition(undefinedfinalword, &__undefined_final);

        Word compositeword = env.definitionTable.TokToWord(COMPOSITEWORD);
        env.AddPrimaryDefinition(compositeword, &__composite);

        Word inactionword = env.definitionTable.TokToWord(INACTIONWORD);
        env.AddPrimaryDefinition(inactionword, &__inaction);

        Word preevalword = env.definitionTable.TokToWord(PREEVALWORD);
        Definition& preevaldefinition = env.definitionTable[preevalword];
        preevaldefinition.type = inactionword;
        preevaldefinition.value.number = 0;

        Word undefinedword = env.definitionTable.TokToWord(UNDEFINEDWORD);
        CompositeDefinition *undefinedworddefptr = new CompositeDefinition();
        undefinedworddefptr->f = wordcompword;
        undefinedworddefptr->g = undefinedfinalword;
        Definition& undefineddefinition 
            = env.definitionTable[undefinedword];
        undefineddefinition.type = compositeword;
        undefineddefinition.value.pointer = undefinedworddefptr;

        Word useword = env.definitionTable.TokToWord(USEWORD);
        env.AddPrimaryDefinition(useword, __use);
    }